

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::StandardCaseItemSyntax::StandardCaseItemSyntax
          (StandardCaseItemSyntax *this,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions,Token colon,
          SyntaxNode *clause)

{
  bool bVar1;
  ExpressionSyntax *pEVar2;
  SyntaxNode *pSVar3;
  ExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *local_30;
  SyntaxNode *clause_local;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions_local;
  StandardCaseItemSyntax *this_local;
  Token colon_local;
  
  colon_local._0_8_ = colon.info;
  this_local = colon._0_8_;
  local_30 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)clause;
  clause_local = (SyntaxNode *)expressions;
  expressions_local = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)this;
  CaseItemSyntax::CaseItemSyntax(&this->super_CaseItemSyntax,StandardCaseItem);
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (&this->expressions,(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)clause_local
            );
  *(StandardCaseItemSyntax **)&this->colon = this_local;
  (this->colon).info = (Info *)colon_local._0_8_;
  __range2 = local_30;
  not_null<slang::syntax::SyntaxNode*>::not_null<slang::syntax::SyntaxNode*,void>
            ((not_null<slang::syntax::SyntaxNode*> *)&this->clause,(SyntaxNode **)&__range2);
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin(&this->expressions);
  _child = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(&this->expressions);
  while( true ) {
    bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                          *)&__end2.index,(iterator_base<slang::syntax::ExpressionSyntax_*> *)&child
                        );
    if (!bVar1) break;
    pEVar2 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::operator*
                       ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&__end2.index);
    (pEVar2->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                  *)&__end2.index);
  }
  pSVar3 = not_null<slang::syntax::SyntaxNode_*>::operator->(&this->clause);
  pSVar3->parent = (SyntaxNode *)this;
  return;
}

Assistant:

StandardCaseItemSyntax(const SeparatedSyntaxList<ExpressionSyntax>& expressions, Token colon, SyntaxNode& clause) :
        CaseItemSyntax(SyntaxKind::StandardCaseItem), expressions(expressions), colon(colon), clause(&clause) {
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
        this->clause->parent = this;
    }